

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)9>_> * __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::createImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,
          ImageClearingTestInstance *this,VkImageType imageType,VkFormat format,VkExtent3D extent,
          VkImageUsageFlags usage)

{
  undefined1 local_98 [8];
  VkImageCreateInfo imageCreateInfo;
  VkFormat format_local;
  VkImageType imageType_local;
  ImageClearingTestInstance *this_local;
  VkExtent3D extent_local;
  
  imageCreateInfo.extent.width = extent.depth;
  imageCreateInfo._20_8_ = extent._0_8_;
  local_98._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageCreateInfo._4_4_ = 0;
  imageCreateInfo.pNext._0_4_ = 0;
  imageCreateInfo.extent.height = this->m_imageMipLevels;
  imageCreateInfo.extent.depth = 1;
  imageCreateInfo.mipLevels = 1;
  imageCreateInfo.arrayLayers = 0;
  imageCreateInfo.samples = usage;
  imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageCreateInfo.usage = 1;
  imageCreateInfo._64_8_ = &this->m_queueFamilyIndex;
  imageCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  imageCreateInfo.pNext._4_4_ = imageType;
  imageCreateInfo.flags = format;
  imageCreateInfo.initialLayout = format;
  imageCreateInfo._84_4_ = imageType;
  ::vk::createImage(__return_storage_ptr__,this->m_vkd,this->m_device,(VkImageCreateInfo *)local_98,
                    (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> ImageClearingTestInstance::createImage (VkImageType imageType, VkFormat format, VkExtent3D extent, VkImageUsageFlags usage) const
{
	const VkImageCreateInfo					imageCreateInfo			=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0u,											// VkImageCreateFlags		flags;
		imageType,									// VkImageType				imageType;
		format,										// VkFormat					format;
		extent,										// VkExtent3D				extent;
		m_imageMipLevels,							// deUint32					mipLevels;
		1u,											// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
		usage,										// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
		1u,											// deUint32					queueFamilyIndexCount;
		&m_queueFamilyIndex,						// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
	};

	return vk::createImage(m_vkd, m_device, &imageCreateInfo, DE_NULL);
}